

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLBREAKAWAY_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000128;
  double *in_stack_00000130;
  double *in_stack_00000138;
  double *in_stack_00000140;
  int in_stack_0000014c;
  int in_stack_00000150;
  int *in_stack_00000160;
  int *in_stack_00000168;
  int *in_stack_00000170;
  
  TVar1 = TA_CDLBREAKAWAY(in_stack_00000150,in_stack_0000014c,in_stack_00000140,in_stack_00000138,
                          in_stack_00000130,in_stack_00000128,in_stack_00000160,in_stack_00000168,
                          in_stack_00000170);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLBREAKAWAY_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLBREAKAWAY(
/* Generated */                      startIdx,
/* Generated */                      endIdx,
/* Generated */                      params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                      params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                      params->in[0].data.inPrice.low, /* inLow */
/* Generated */                      params->in[0].data.inPrice.close, /* inClose */
/* Generated */                      outBegIdx, 
/* Generated */                      outNBElement, 
/* Generated */                      params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }